

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O2

string * ip2string_abi_cxx11_(string *__return_storage_ptr__,uint32_t ip)

{
  ostream *poVar1;
  ostringstream out;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&out);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&out);
  poVar1 = std::operator<<(poVar1,'.');
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,'.');
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,'.');
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&out);
  return __return_storage_ptr__;
}

Assistant:

inline std::string ip2string(const uint32_t ip)
{
  std::ostringstream out;

  out << ((ip>>24)&0xff) << '.' << ((ip>>16)&0xff) << '.'
      << ((ip>>8)&0xff) << '.' << (ip&0xff);

  return out.str();
}